

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetRepeatedEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int index,int value)

{
  uint32_t uVar1;
  RepeatedField<int> *this_00;
  pointer piVar2;
  
  if ((field->field_0x1 & 8) == 0) {
    VerifyFieldType<google::protobuf::RepeatedField<int>>(this,field);
    this_00 = (RepeatedField<int> *)MutableRawImpl(this,message,field);
    piVar2 = RepeatedField<int>::Mutable(this_00,index);
    *piVar2 = value;
    return;
  }
  uVar1 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
  internal::ExtensionSet::SetRepeatedEnum
            ((ExtensionSet *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
             field->number_,index,value);
  return;
}

Assistant:

void Reflection::SetRepeatedEnumValueInternal(Message* message,
                                              const FieldDescriptor* field,
                                              int index, int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedEnum(field->number(), index,
                                                  value);
  } else {
    SetRepeatedField<int>(message, field, index, value);
  }
}